

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double bessel_i1(double arg)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double zero;
  double xx;
  double xmax;
  double x;
  double value;
  double two25;
  double sumq;
  double sump;
  double rec15;
  double r8_huge;
  double qq [6];
  double q [5];
  double local_118;
  double pp [8];
  double pbar;
  double p [15];
  double one5;
  double one;
  int j;
  double half;
  double forty;
  double exp40;
  double b;
  double a;
  double arg_local;
  
  p[0xe] = 15.0;
  memcpy(&pbar,&DAT_0025e820,0x78);
  memcpy(&local_118,&DAT_0025e8a0,0x40);
  memset(qq + 5,0,0x28);
  qq[5] = -4007.686467990419;
  memset(&r8_huge,0,0x30);
  r8_huge = -3.8806586721556595;
  qq[0] = 3.2593714889036995;
  qq[1] = -0.8501747646321792;
  qq[2] = 0.07421201081318653;
  qq[3] = -0.0022835624489492513;
  qq[4] = 3.751043311192282e-05;
  dVar1 = ABS(arg);
  dVar2 = r8_epsilon();
  if (dVar2 <= dVar1) {
    if (p[0xe] <= dVar1) {
      if (dVar1 <= 713.987) {
        dVar2 = 1.0 / dVar1 - 0.06666666666666667;
        dVar3 = (((((dVar2 + r8_huge) * dVar2 + qq[0]) * dVar2 + qq[1]) * dVar2 + qq[2]) * dVar2 +
                qq[3]) * dVar2 + qq[4];
        if (dVar1 <= 713.987 - p[0xe]) {
          b = exp(dVar1);
          exp40 = 1.0;
        }
        else {
          b = exp(dVar1 - 40.0);
          exp40 = 2.3538526683702e+17;
        }
        dVar1 = sqrt(dVar1);
        x = ((((((((((local_118 * dVar2 + pp[0]) * dVar2 + pp[1]) * dVar2 + pp[2]) * dVar2 + pp[3])
                  * dVar2 + pp[4]) * dVar2 + pp[5]) * dVar2 + pp[6]) / dVar3) * b + b * 0.3984375) /
            dVar1) * exp40;
      }
      else {
        x = 1e+30;
      }
    }
    else {
      sumq = pbar;
      for (one._4_4_ = 1; one._4_4_ < 0xf; one._4_4_ = one._4_4_ + 1) {
        sumq = sumq * dVar1 * dVar1 + p[(long)one._4_4_ + -1];
      }
      dVar2 = dVar1 * dVar1 - 225.0;
      x = (sumq / (((((dVar2 + qq[5]) * dVar2 + 7481058.0356655065) * dVar2 + -8005951899.861977) *
                    dVar2 + 4854471425827.362) * dVar2 + -1321816830732144.2)) * dVar1;
    }
  }
  else {
    x = dVar1 * 0.5;
  }
  if (arg < 0.0) {
    x = -x;
  }
  return x;
}

Assistant:

double bessel_i1 ( double arg )

//****************************************************************************80
//
//  Purpose:
//
//    BESSEL_I1 evaluates the Bessel I function of order I.
//
//  Discussion:
//
//    The main computation evaluates slightly modified forms of
//    minimax approximations generated by Blair and Edwards.
//    This transportable program is patterned after the machine-dependent
//    FUNPACK packet NATSI1, but cannot match that version for efficiency
//    or accuracy.  This version uses rational functions that theoretically
//    approximate I-SUB-1(X) to at least 18 significant decimal digits.
//    The accuracy achieved depends on the arithmetic system, the compiler,
//    the intrinsic functions, and proper selection of the machine-dependent
//    constants.
//
//  Machine-dependent constants:
//
//    beta   = Radix for the floating-point system.
//    maxexp = Smallest power of beta that overflows.
//    XMAX =   Largest argument acceptable to BESI1;  Solution to
//             equation:
//               EXP(X) * (1-3/(8*X)) / SQRT(2*PI*X) = beta^maxexp
//
//
//    Approximate values for some important machines are:
//
//                            beta       maxexp    XMAX
//
//    CRAY-1        (S.P.)       2         8191    5682.810
//    Cyber 180/855
//      under NOS   (S.P.)       2         1070     745.894
//    IEEE (IBM/XT,
//      SUN, etc.)  (S.P.)       2          128      91.906
//    IEEE (IBM/XT,
//      SUN, etc.)  (D.P.)       2         1024     713.987
//    IBM 3033      (D.P.)      16           63     178.185
//    VAX           (S.P.)       2          127      91.209
//    VAX D-Format  (D.P.)       2          127      91.209
//    VAX G-Format  (D.P.)       2         1023     713.293
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    28 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by William Cody, Laura Stoltz,
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Blair, Edwards,
//    Chalk River Report AECL-4928,
//    Atomic Energy of Canada, Limited,
//    October, 1974.
//
//  Parameters:
//
//    Input, double ARG, the argument.
//
//    Output, double BESSEL_I1, the value of the Bessel
//    I1 function.
//
{
  double a;
  double b;
  double exp40 = 2.353852668370199854E+17;
  double forty = 40.0;
  double half = 0.5;
  int j;
  double one = 1.0;
  double one5 = 15.0;
  double p[15] = {
    -1.9705291802535139930E-19,
    -6.5245515583151902910E-16,
    -1.1928788903603238754E-12,
    -1.4831904935994647675E-09,
    -1.3466829827635152875E-06,
    -9.1746443287817501309E-04,
    -4.7207090827310162436E-01,
    -1.8225946631657315931E+02,
    -5.1894091982308017540E+04,
    -1.0588550724769347106E+07,
    -1.4828267606612366099E+09,
    -1.3357437682275493024E+11,
    -6.9876779648010090070E+12,
    -1.7732037840791591320E+14,
    -1.4577180278143463643E+15 };
  double pbar = 3.98437500E-01;
  double pp[8] = {
    -6.0437159056137600000E-02,
     4.5748122901933459000E-01,
    -4.2843766903304806403E-01,
     9.7356000150886612134E-02,
    -3.2457723974465568321E-03,
    -3.6395264712121795296E-04,
     1.6258661867440836395E-05,
    -3.6347578404608223492E-07 };
  double q[5] = {
    -4.0076864679904189921E+03,
     7.4810580356655069138E+06,
    -8.0059518998619764991E+09,
     4.8544714258273622913E+12,
    -1.3218168307321442305E+15 };
  double qq[6] = {
    -3.8806586721556593450,
     3.2593714889036996297,
    -8.5017476463217924408E-01,
     7.4212010813186530069E-02,
    -2.2835624489492512649E-03,
     3.7510433111922824643E-05 };
  double r8_huge = 1.0E+30;
  double rec15 = 6.6666666666666666666E-02;
  double sump;
  double sumq;
  double two25 = 225.0;
  double value;
  double x;
  double xmax = 713.987;
  double xx;
  double zero = 0.0;

  x = fabs ( arg );
//
//  ABS(ARG) < EPSILON ( ARG )
//
  if ( x < r8_epsilon ( ) )
  {
    value = half * x;
  }
//
//  EPSILON ( ARG ) <= ABS(ARG) < 15.0
//
  else if ( x < one5 )
  {
    xx = x * x;
    sump = p[0];
    for ( j = 1; j < 15; j++ )
    {
      sump = sump * xx + p[j];
    }

    xx = xx - two25;

    sumq = ((((
          xx + q[0]
      ) * xx + q[1]
      ) * xx + q[2]
      ) * xx + q[3]
      ) * xx + q[4];

    value = ( sump / sumq ) * x;
  }
  else if ( xmax < x )
  {
    value = r8_huge;
  }
//
//  15.0 <= ABS(ARG)
//
  else
  {
    xx = one / x - rec15;

    sump = ((((((
               pp[0]
        * xx + pp[1]
      ) * xx + pp[2]
      ) * xx + pp[3]
      ) * xx + pp[4]
      ) * xx + pp[5]
      ) * xx + pp[6]
      ) * xx + pp[7];

    sumq = (((((
          xx + qq[0]
      ) * xx + qq[1]
      ) * xx + qq[2]
      ) * xx + qq[3]
      ) * xx + qq[4]
      ) * xx + qq[5];

    value = sump / sumq;

    if ( xmax - one5 < x )
    {
      a = exp ( x - forty );
      b = exp40;
    }
    else
    {
      a = exp ( x );
      b = one;
    }
    value = ( ( value * a + pbar * a ) / sqrt ( x ) ) * b;
  }

  if ( arg < zero )
  {
    value = - value;
  }

  return value;
}